

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_function_wrapper.cpp
# Opt level: O0

void __thiscall
cpp_bindgen::anon_unknown_0::wrap_array_descriptor_Test::TestBody(wrap_array_descriptor_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_a0 [3];
  Message local_88;
  result_converted_to_c_t<int> local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  undefined1 local_60 [7];
  wrapped_f<int_(int_(&)[2][3],_unsigned_long,_unsigned_long),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_wdeconinck[P]cpp_bindgen_tests_unit_tests_test_function_wrapper_cpp:139:17)>
  get;
  bindgen_fortran_array_descriptor descriptor;
  int array [2] [3];
  wrap_array_descriptor_Test *this_local;
  
  descriptor.is_acc_present = true;
  descriptor._49_7_ = 0x2000000;
  descriptor._32_8_ = &descriptor.is_acc_present;
  local_60._0_4_ = bindgen_fk_Int;
  stack0xffffffffffffffa4 = 2;
  descriptor.type = bindgen_fk_Long;
  descriptor.rank = 2;
  descriptor.data._0_1_ = 0;
  wrap<int(int(&)[2][3],unsigned_long,unsigned_long),cpp_bindgen::(anonymous_namespace)::wrap_array_descriptor_Test::TestBody()::__0>
            ((anon_class_1_0_00000001_for_m_fun *)((long)&gtest_ar.message_.ptr_ + 6));
  local_7c = _impl::
             wrapped_f<int_(int_(&)[2][3],_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_function_wrapper.cpp:139:17)>
             ::operator()((wrapped_f<int_(int_(&)[2][3],_unsigned_long,_unsigned_long),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_wdeconinck[P]cpp_bindgen_tests_unit_tests_test_function_wrapper_cpp:139:17)>
                           *)((long)&gtest_ar.message_.ptr_ + 7),
                          (param_converted_to_c_t<int_(&)[2][3]>)local_60,0,0);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_78,"array[0][0]","get(&descriptor, 0, 0)",
             (int *)&descriptor.is_acc_present,&local_7c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_function_wrapper.cpp"
               ,0x8c,message);
    testing::internal::AssertHelper::operator=(local_a0,&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  return;
}

Assistant:

TEST(wrap, array_descriptor) {
            int array[2][3] = {{1, 2, 3}, {4, 5, 6}};
            bindgen_fortran_array_descriptor descriptor;
            descriptor.data = array;
            descriptor.type = bindgen_fk_Int;
            descriptor.rank = 2;
            descriptor.dims[0] = 3;
            descriptor.dims[1] = 2;
            descriptor.is_acc_present = false;

            auto get = wrap<int(int(&)[2][3], size_t, size_t)>(
                [](int(&array)[2][3], size_t i, size_t j) { return array[i][j]; });
            EXPECT_EQ(array[0][0], get(&descriptor, 0, 0));
        }